

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModulationType.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::ModulationType::ModulationType
          (ModulationType *this,KBOOL FreqHop,KBOOL PseudoNoise,KBOOL TimeHop,
          KUINT16 MajorModulation,KUINT16 Detail,KUINT16 System)

{
  KUINT16 Detail_local;
  KUINT16 MajorModulation_local;
  KBOOL TimeHop_local;
  KBOOL PseudoNoise_local;
  KBOOL FreqHop_local;
  ModulationType *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__ModulationType_0032ee08;
  *(byte *)&this->field_0 = *(byte *)&this->field_0 & 0xfe | FreqHop;
  *(byte *)&this->field_0 = *(byte *)&this->field_0 & 0xfd | PseudoNoise << 1;
  *(byte *)&this->field_0 = *(byte *)&this->field_0 & 0xfb | TimeHop << 2;
  this->m_ui16MajorModulationType = MajorModulation;
  this->m_ui16Detail = Detail;
  this->m_ui16System = System;
  return;
}

Assistant:

ModulationType::ModulationType( KBOOL FreqHop, KBOOL PseudoNoise, KBOOL TimeHop,
                                KUINT16 MajorModulation, KUINT16 Detail,
                                KUINT16 System ) :
    m_ui16FreqHop( FreqHop ),
    m_ui16PseudoNoise( PseudoNoise ),
    m_ui16TimeHop( TimeHop ),
    m_ui16MajorModulationType( MajorModulation ),
    m_ui16Detail( Detail ),
    m_ui16System( System )
{
}